

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_icu.cpp
# Opt level: O0

QString * __thiscall QLocalePrivate::toUpper(QLocalePrivate *this,QString *str,bool *ok)

{
  bool bVar1;
  undefined8 in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  QString *in_stack_00000008;
  QString *in_stack_00000010;
  QString *out;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  Ptr_u_strToCase caseFunc;
  
  caseFunc = *(Ptr_u_strToCase *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x72b809);
  bcp47Name((QLocalePrivate *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
            (char)((ulong)caseFunc >> 0x38));
  QByteArray::operator_cast_to_char_((QByteArray *)0x72b833);
  bVar1 = qt_u_strToCase(in_stack_00000010,in_stack_00000008,unaff_retaddr,caseFunc);
  *(bool *)in_RCX = bVar1;
  QByteArray::~QByteArray((QByteArray *)0x72b873);
  if (*(Ptr_u_strToCase *)(in_FS_OFFSET + 0x28) != caseFunc) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocalePrivate::toUpper(const QString &str, bool *ok) const
{
    Q_ASSERT(ok);
    QString out;
    *ok = qt_u_strToCase(str, &out, bcp47Name('_'), u_strToUpper);
    return out;
}